

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

void write_v7m_exception_arm(CPUARMState *env,uint32_t new_exc)

{
  uint32_t uVar1;
  byte bVar2;
  byte bVar3;
  
  if ((env->v7m).exception == 0) {
    bVar2 = ((byte)(env->v7m).control[(env->v7m).secure] & 2) >> 1;
  }
  else {
    bVar2 = 0;
  }
  (env->v7m).exception = new_exc;
  if (new_exc == 0) {
    bVar3 = ((byte)(env->v7m).control[(env->v7m).secure] & 2) >> 1;
  }
  else {
    bVar3 = 0;
  }
  if (bVar2 != bVar3) {
    uVar1 = (env->v7m).other_sp;
    (env->v7m).other_sp = env->regs[0xd];
    env->regs[0xd] = uVar1;
  }
  return;
}

Assistant:

static inline bool arm_v7m_is_handler_mode(CPUARMState *env)
{
    return env->v7m.exception != 0;
}